

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O3

uchar FSE_decodeSymbol(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD)

{
  byte bVar1;
  uchar uVar2;
  ushort uVar3;
  size_t sVar4;
  void *pvVar5;
  uint uVar6;
  
  sVar4 = DStatePtr->state;
  pvVar5 = DStatePtr->table;
  bVar1 = *(byte *)((long)pvVar5 + sVar4 * 4 + 3);
  if (bVar1 < 0x20) {
    uVar6 = (uint)bVar1 + bitD->bitsConsumed;
    uVar2 = *(uchar *)((long)pvVar5 + sVar4 * 4 + 2);
    uVar3 = *(ushort *)((long)pvVar5 + sVar4 * 4);
    bitD->bitsConsumed = uVar6;
    DStatePtr->state =
         (~(-1L << (bVar1 & 0x3f)) & bitD->bitContainer >> (-(char)uVar6 & 0x3fU)) + (ulong)uVar3;
    return uVar2;
  }
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bitstream.h"
                ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
}

Assistant:

MEM_STATIC BYTE FSE_decodeSymbol(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD)
{
    FSE_decode_t const DInfo = ((const FSE_decode_t*)(DStatePtr->table))[DStatePtr->state];
    U32 const nbBits = DInfo.nbBits;
    BYTE const symbol = DInfo.symbol;
    size_t const lowBits = BIT_readBits(bitD, nbBits);

    DStatePtr->state = DInfo.newState + lowBits;
    return symbol;
}